

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_cid.c
# Opt level: O1

HPDF_STATUS HPDF_CIDFontDef_ChangeStyle(HPDF_FontDef fontdef,HPDF_BOOL bold,HPDF_BOOL italic)

{
  byte *pbVar1;
  HPDF_STATUS HVar2;
  
  HVar2 = 0x102d;
  if ((fontdef != (HPDF_FontDef)0x0) && (fontdef->attr != (void *)0x0)) {
    if (bold != 0) {
      fontdef->stemv = fontdef->stemv << 1;
      pbVar1 = (byte *)((long)&fontdef->flags + 2);
      *pbVar1 = *pbVar1 | 4;
    }
    if (italic != 0) {
      fontdef->italic_angle = fontdef->italic_angle + -0xb;
      *(byte *)&fontdef->flags = (byte)fontdef->flags | 0x40;
    }
    HVar2 = 0;
  }
  return HVar2;
}

Assistant:

HPDF_STATUS
HPDF_CIDFontDef_ChangeStyle  (HPDF_FontDef   fontdef,
                              HPDF_BOOL      bold,
                              HPDF_BOOL      italic)
{
    HPDF_PTRACE ((" HPDF_CIDFontDef_ChangeStyle\n"));

    if (!fontdef || !fontdef->attr)
        return HPDF_INVALID_FONTDEF_DATA;

    if (bold) {
        fontdef->stemv *= 2;
        fontdef->flags |= HPDF_FONT_FOURCE_BOLD;
    }

    if (italic) {
        fontdef->italic_angle -= 11;
        fontdef->flags |= HPDF_FONT_ITALIC;
    }

    return HPDF_OK;
}